

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void CConsole::ConModCommandStatus(IResult *pResult,void *pUser)

{
  int iVar1;
  uint size;
  uint uVar2;
  long *in_RSI;
  long in_FS_OFFSET;
  int Length;
  CCommand *pCommand;
  int Used;
  CConsole *pConsole;
  char aBuf [240];
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  void *in_stack_fffffffffffffee0;
  CCommandInfo *this;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 local_f8 [240];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  uVar2 = 0;
  for (this = (CCommandInfo *)in_RSI[5]; this != (CCommandInfo *)0x0;
      this = (CCommandInfo *)this[1]._vptr_CCommandInfo) {
    size = uVar2;
    if (((this[1].m_AccessLevel & *(uint *)(in_RSI + 2)) != 0) &&
       (iVar1 = IConsole::CCommandInfo::GetAccessLevel(this), size = uVar2, iVar1 == 1)) {
      size = str_length((char *)0x22bdab);
      if ((int)(uVar2 + size + 2) < 0xf0) {
        if (0 < (int)uVar2) {
          uVar2 = uVar2 + 2;
          str_append((char *)in_RSI,(char *)CONCAT44(uVar2,in_stack_fffffffffffffee8),
                     (int)((ulong)this >> 0x20));
        }
        str_append((char *)in_RSI,(char *)CONCAT44(uVar2,in_stack_fffffffffffffee8),
                   (int)((ulong)this >> 0x20));
        size = size + uVar2;
      }
      else {
        (**(code **)(*in_RSI + 200))(in_RSI,0,"console",local_f8);
        mem_zero(this,size);
        str_copy((char *)this,(char *)CONCAT44(size,in_stack_fffffffffffffed8),0);
      }
    }
    uVar2 = size;
  }
  if (0 < (int)uVar2) {
    (**(code **)(*in_RSI + 200))(in_RSI,0,"console",local_f8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConsole::ConModCommandStatus(IResult *pResult, void *pUser)
{
	CConsole* pConsole = static_cast<CConsole *>(pUser);
	char aBuf[240];
	mem_zero(aBuf, sizeof(aBuf));
	int Used = 0;

	for(CCommand *pCommand = pConsole->m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&pConsole->m_FlagMask && pCommand->GetAccessLevel() == ACCESS_LEVEL_MOD)
		{
			int Length = str_length(pCommand->m_pName);
			if(Used + Length + 2 < (int)(sizeof(aBuf)))
			{
				if(Used > 0)
				{
					Used += 2;
					str_append(aBuf, ", ", sizeof(aBuf));
				}
				str_append(aBuf, pCommand->m_pName, sizeof(aBuf));
				Used += Length;
			}
			else
			{
				pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
				mem_zero(aBuf, sizeof(aBuf));
				str_copy(aBuf, pCommand->m_pName, sizeof(aBuf));
				Used = Length;
			}
		}
	}
	if(Used > 0)
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}